

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoftp.c
# Opt level: O0

void xmlNanoFTPScanProxy(char *URL)

{
  int iVar1;
  xmlURIPtr uri_00;
  xmlURIPtr uri;
  char *URL_local;
  
  if (proxy != (char *)0x0) {
    (*xmlFree)(proxy);
    proxy = (char *)0x0;
  }
  proxyPort = 0;
  if (URL != (char *)0x0) {
    uri_00 = xmlParseURIRaw(URL,1);
    if ((((uri_00 == (xmlURIPtr)0x0) || (uri_00->scheme == (char *)0x0)) ||
        (iVar1 = strcmp(uri_00->scheme,"ftp"), iVar1 != 0)) || (uri_00->server == (char *)0x0)) {
      __xmlIOErr(9,0x7d3,"Syntax Error\n");
      if (uri_00 != (xmlURIPtr)0x0) {
        xmlFreeURI(uri_00);
      }
    }
    else {
      proxy = (*xmlMemStrdup)(uri_00->server);
      if (uri_00->port != 0) {
        proxyPort = uri_00->port;
      }
      xmlFreeURI(uri_00);
    }
  }
  return;
}

Assistant:

void
xmlNanoFTPScanProxy(const char *URL) {
    xmlURIPtr uri;

    if (proxy != NULL) {
        xmlFree(proxy);
	proxy = NULL;
    }
    proxyPort = 0;

#ifdef DEBUG_FTP
    if (URL == NULL)
	xmlGenericError(xmlGenericErrorContext,
		"Removing FTP proxy info\n");
    else
	xmlGenericError(xmlGenericErrorContext,
		"Using FTP proxy %s\n", URL);
#endif
    if (URL == NULL) return;

    uri = xmlParseURIRaw(URL, 1);
    if ((uri == NULL) || (uri->scheme == NULL) ||
	(strcmp(uri->scheme, "ftp")) || (uri->server == NULL)) {
	__xmlIOErr(XML_FROM_FTP, XML_FTP_URL_SYNTAX, "Syntax Error\n");
	if (uri != NULL)
	    xmlFreeURI(uri);
	return;
    }

    proxy = xmlMemStrdup(uri->server);
    if (uri->port != 0)
	proxyPort = uri->port;

    xmlFreeURI(uri);
}